

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O2

char * wabt::GetDecompTypeName(Type t)

{
  Enum EVar1;
  
  EVar1 = t.enum_;
  switch(EVar1) {
  case I8U:
    return "ubyte";
  case I16U:
    return "ushort";
  case I32U:
    return "uint";
  case ExternRef:
    return "externref";
  case FuncRef:
    return "funcref";
  case 0xfffffff1:
  case 0xfffffff2:
  case 0xfffffff3:
  case FuncRef|I8U:
  case 0xfffffff5:
  case FuncRef|I16U:
  case FuncRef|I32U:
  case ~I32U:
  case Any:
  case ~I64:
  case ~F32:
  case ~F64:
  case ~I8:
    goto switchD_00152dc5_caseD_fffffff1;
  case I16:
    return "short";
  case I8:
    return "byte";
  case V128:
    return "simd";
  case F64:
    return "double";
  case F32:
    return "float";
  case I64:
    return "long";
  case I32:
    return "int";
  default:
    if (EVar1 == Void) {
      return "void";
    }
    if (EVar1 == Func) {
      return "func";
    }
switchD_00152dc5_caseD_fffffff1:
    return "ILLEGAL";
  }
}

Assistant:

inline const char* GetDecompTypeName(Type t) {
  switch (t) {
    case Type::I8: return "byte";
    case Type::I8U: return "ubyte";
    case Type::I16: return "short";
    case Type::I16U: return "ushort";
    case Type::I32: return "int";
    case Type::I32U: return "uint";
    case Type::I64: return "long";
    case Type::F32: return "float";
    case Type::F64: return "double";
    case Type::V128: return "simd";
    case Type::Func: return "func";
    case Type::FuncRef: return "funcref";
    case Type::ExternRef: return "externref";
    case Type::Void: return "void";
    default: return "ILLEGAL";
  }
}